

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::spinlock::spinlock(spinlock *this)

{
  int iVar1;
  pthread_spinlock_t *in_RDI;
  uint in_stack_000001f4;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  
  iVar1 = pthread_spin_init(in_RDI,0);
  if (iVar1 != 0) {
    crnlib_fail(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
  }
  return;
}

Assistant:

spinlock::spinlock() {
#if !defined(__APPLE__)
  if (pthread_spin_init(&m_spinlock, 0)) {
    CRNLIB_FAIL("spinlock: pthread_spin_init() failed");
  }
#else
  m_lock = new os_unfair_lock();
  *m_lock = OS_UNFAIR_LOCK_INIT;
#endif
}